

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linker.c
# Opt level: O0

void linker_dynprep(GlobalVars *gv)

{
  node *pnVar1;
  GlobalVars *in_RDI;
  Symbol **chain;
  Symbol *sym;
  int i;
  Symbol *in_stack_ffffffffffffffd8;
  GlobalVars *gv_00;
  int local_c;
  
  hide_shlib_symbols(in_RDI);
  if ((in_RDI->dest_sharedobj != 0) || (in_RDI->dyn_exp_all != 0)) {
    for (local_c = 0; local_c < 0x10000; local_c = local_c + 1) {
      gv_00 = (GlobalVars *)(in_RDI->symbols + local_c);
      while (pnVar1 = (gv_00->libpaths).first, pnVar1 != (node *)0x0) {
        if ((((1 < *(byte *)((long)&pnVar1[4].next + 3)) && (((ulong)pnVar1[4].next & 0x1000) == 0))
            && (pnVar1[3].pred != (node *)0x0)) &&
           (((ulong)pnVar1[3].pred[1].next[8].next & 1) != 0)) {
          dyn_export(gv_00,in_stack_ffffffffffffffd8);
        }
        gv_00 = (GlobalVars *)(pnVar1 + 1);
      }
    }
  }
  if ((in_RDI->dynamic != 0) &&
     (fff[in_RDI->dest_format]->dyncreate != (_func_void_GlobalVars_ptr *)0x0)) {
    (*fff[in_RDI->dest_format]->dyncreate)(in_RDI);
  }
  return;
}

Assistant:

void linker_dynprep(struct GlobalVars *gv)
/* Preparations for dynamic linking */
{
  /* hide unreferenced symbols from a shared library */
  hide_shlib_symbols(gv);

  /* export all global symbols when creating a shared library */
  if (gv->dest_sharedobj || gv->dyn_exp_all) {
    int i;

    for (i=0; i<SYMHTABSIZE; i++) {
      struct Symbol *sym;
      struct Symbol **chain = &gv->symbols[i];

      while (sym = *chain) {
        if (sym->bind>=SYMB_GLOBAL && !(sym->flags & SYMF_SHLIB) &&
            sym->relsect!=NULL && (sym->relsect->obj->flags & OUF_LINKED))
          dyn_export(gv,sym);
        chain = &sym->glob_chain;
      }
    }
  }

  /* let the target create and populate dynamic sections when needed */
  if (gv->dynamic && fff[gv->dest_format]->dyncreate)
    fff[gv->dest_format]->dyncreate(gv);
}